

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 *puVar1;
  int r;
  long lVar2;
  long lVar3;
  float *this;
  Matrix<float,_2,_2> retVal;
  Type in0;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  undefined1 local_44 [20];
  float local_30;
  float local_2c;
  VecAccess<float,_4,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)local_44,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_44,(float *)sr::(anonymous_namespace)::s_constInMat2x2);
  }
  this = &local_54;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  puVar1 = local_44;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      this[lVar3 * 2] = -*(float *)(puVar1 + lVar3 * 8);
    }
    this = this + 1;
    puVar1 = puVar1 + 4;
  }
  local_2c = local_50 + local_48;
  local_44._16_4_ = local_54;
  local_30 = local_4c;
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)(local_44 + 0x10));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}